

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

void __thiscall
kratos::SystemVerilogCodeGen::generate_parameters(SystemVerilogCodeGen *this,Generator *generator)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  _Rb_tree_header *p_Var3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar4;
  ParamType PVar5;
  Param *this_00;
  int64_t value;
  long lVar6;
  undefined8 uVar7;
  uint32_t width;
  ostream *poVar8;
  _Base_ptr p_Var9;
  ulong uVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view sVar11;
  undefined1 auStack_378 [8];
  Const c;
  string local_b8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *local_98;
  string type_str;
  string value_str;
  string param_str;
  
  if ((generator->params_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    puVar1 = &(this->stream_).super_stringstream.field_0x10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"#(",2);
    puVar2 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar2 = *(long *)puVar2 + 1;
    auStack_378[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,auStack_378,1);
    this->indent_ = this->indent_ + 1;
    p_Var9 = (generator->params_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var3 = &(generator->params_)._M_t._M_impl.super__Rb_tree_header;
    param_str.field_2._8_8_ = this;
    if ((_Rb_tree_header *)p_Var9 != p_Var3) {
      uVar10 = 1;
      do {
        type_str.field_2._8_8_ = &value_str._M_string_length;
        value_str._M_dataplus._M_p = (pointer)0x0;
        value_str._M_string_length._0_1_ = 0;
        local_98 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    *)&type_str._M_string_length;
        type_str._M_dataplus._M_p = (pointer)0x0;
        type_str._M_string_length._0_1_ = 0;
        this_00 = *(Param **)(p_Var9 + 2);
        if (((this_00->initial_value_).super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged & 1U) == 0) {
          PVar5 = this_00->param_type_;
          if (PVar5 != Parameter) {
            if (PVar5 == Enum) {
              std::__cxx11::string::_M_assign((string *)&local_98);
            }
            else if (PVar5 == RawType) {
              std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)0x0,0x23f376);
              lVar6 = *(long *)(p_Var9 + 2);
              c.super_Var.super_IRNode.fn_name_ln.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)((ulong)c.super_Var.super_IRNode.fn_name_ln.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage &
                            0xffffffffffffff00);
              if (*(char *)(lVar6 + 0x3a8) == '\x01') {
                pvVar4 = &c.super_Var.super_IRNode.fn_name_ln;
                auStack_378 = (undefined1  [8])pvVar4;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)auStack_378,*(long *)(lVar6 + 0x388),
                           *(long *)(lVar6 + 0x390) + *(long *)(lVar6 + 0x388));
                c.super_Var.super_IRNode.fn_name_ln.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)((ulong)c.super_Var.super_IRNode.fn_name_ln.
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage &
                              0xffffffffffffff00);
                if (auStack_378 != (undefined1  [8])pvVar4) {
                  operator_delete((void *)auStack_378,
                                  (ulong)((long)&((c.super_Var.super_IRNode.fn_name_ln.
                                                                                                      
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->first)
                                                 ._M_dataplus._M_p + 1));
                }
                lVar6 = *(long *)(p_Var9 + 2);
                c.super_Var.super_IRNode.fn_name_ln.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)((ulong)c.super_Var.super_IRNode.fn_name_ln.
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage &
                              0xffffffffffffff00);
                if (*(char *)(lVar6 + 0x3a8) == '\x01') {
                  auStack_378 = (undefined1  [8])&c.super_Var.super_IRNode.fn_name_ln;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)auStack_378,*(long *)(lVar6 + 0x388),
                             *(long *)(lVar6 + 0x390) + *(long *)(lVar6 + 0x388));
                  c.super_Var.super_IRNode.fn_name_ln.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)CONCAT71(c.super_Var.super_IRNode.fn_name_ln.
                                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,1)
                  ;
                }
                std::__cxx11::string::operator=
                          ((string *)(type_str.field_2._M_local_buf + 8),(string *)auStack_378);
                if ((char)c.super_Var.super_IRNode.fn_name_ln.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') {
                  c.super_Var.super_IRNode.fn_name_ln.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)((ulong)c.super_Var.super_IRNode.fn_name_ln.
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage &
                                0xffffffffffffff00);
                  if (auStack_378 != (undefined1  [8])&c.super_Var.super_IRNode.fn_name_ln) {
                    operator_delete((void *)auStack_378,
                                    (ulong)((long)&((c.super_Var.super_IRNode.fn_name_ln.
                                                                                                          
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->first)
                                                  ._M_dataplus._M_p + 1));
                  }
                }
              }
              lVar6 = *(long *)(p_Var9 + 2);
              c.super_Var.super_IRNode.fn_name_ln.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)((ulong)c.super_Var.super_IRNode.fn_name_ln.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage &
                            0xffffffffffffff00);
              if (*(char *)(lVar6 + 0x3d0) == '\x01') {
                pvVar4 = &c.super_Var.super_IRNode.fn_name_ln;
                auStack_378 = (undefined1  [8])pvVar4;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)auStack_378,*(long *)(lVar6 + 0x3b0),
                           *(long *)(lVar6 + 0x3b8) + *(long *)(lVar6 + 0x3b0));
                c.super_Var.super_IRNode.fn_name_ln.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)((ulong)c.super_Var.super_IRNode.fn_name_ln.
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage &
                              0xffffffffffffff00);
                if (auStack_378 != (undefined1  [8])pvVar4) {
                  operator_delete((void *)auStack_378,
                                  (ulong)((long)&((c.super_Var.super_IRNode.fn_name_ln.
                                                                                                      
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->first)
                                                 ._M_dataplus._M_p + 1));
                }
                lVar6 = *(long *)(p_Var9 + 2);
                c.super_Var.super_IRNode.fn_name_ln.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)((ulong)c.super_Var.super_IRNode.fn_name_ln.
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage &
                              0xffffffffffffff00);
                if (*(char *)(lVar6 + 0x3d0) == '\x01') {
                  auStack_378 = (undefined1  [8])&c.super_Var.super_IRNode.fn_name_ln;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)auStack_378,*(long *)(lVar6 + 0x3b0),
                             *(long *)(lVar6 + 0x3b8) + *(long *)(lVar6 + 0x3b0));
                  c.super_Var.super_IRNode.fn_name_ln.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)CONCAT71(c.super_Var.super_IRNode.fn_name_ln.
                                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,1)
                  ;
                }
                std::__cxx11::string::operator=
                          ((string *)(type_str.field_2._M_local_buf + 8),(string *)auStack_378);
                if ((char)c.super_Var.super_IRNode.fn_name_ln.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') {
                  c.super_Var.super_IRNode.fn_name_ln.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)((ulong)c.super_Var.super_IRNode.fn_name_ln.
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage &
                                0xffffffffffffff00);
                  goto LAB_001fc856;
                }
              }
            }
            else if (this_00->has_value_ == true) {
              Param::value_str_abi_cxx11_((string *)auStack_378,this_00);
              std::__cxx11::string::operator=
                        ((string *)(type_str.field_2._M_local_buf + 8),(string *)auStack_378);
LAB_001fc856:
              if (auStack_378 != (undefined1  [8])&c.super_Var.super_IRNode.fn_name_ln) {
                operator_delete((void *)auStack_378,
                                (ulong)((long)&((c.super_Var.super_IRNode.fn_name_ln.
                                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->first).
                                               _M_dataplus._M_p + 1));
              }
            }
          }
        }
        else {
          value = (this_00->initial_value_).super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._M_payload._M_value;
          width = (*(this_00->super_Const).super_Var.super_IRNode._vptr_IRNode[7])(this_00);
          Const::Const((Const *)auStack_378,value,width,*(bool *)(*(long *)(p_Var9 + 2) + 0xf0));
          Const::to_string_abi_cxx11_
                    ((string *)(value_str.field_2._M_local_buf + 8),(Const *)auStack_378);
          std::__cxx11::string::operator=
                    ((string *)(type_str.field_2._M_local_buf + 8),
                     (string *)(value_str.field_2._M_local_buf + 8));
          if ((size_type *)value_str.field_2._8_8_ != &param_str._M_string_length) {
            operator_delete((void *)value_str.field_2._8_8_,param_str._M_string_length + 1);
          }
          auStack_378 = (undefined1  [8])&PTR_accept_002a79b0;
          if ((size_type *)c.value_ != &c.hex_value_._M_string_length) {
            operator_delete((void *)c.value_,c.hex_value_._M_string_length + 1);
          }
          Var::~Var((Var *)auStack_378);
        }
        if (type_str._M_dataplus._M_p == (pointer)0x0) {
          value_str.field_2._8_8_ = &param_str._M_string_length;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)((long)&value_str.field_2 + 8),"parameter","");
        }
        else {
          auStack_378 = (undefined1  [8])local_98;
          c.super_Var.super_IRNode._vptr_IRNode = (_func_int **)type_str._M_dataplus._M_p;
          format_str.size_ = 0xd;
          format_str.data_ = (char *)0xd;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)auStack_378;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)((long)&value_str.field_2 + 8),(detail *)"parameter {0}",format_str,
                     args);
        }
        sVar11 = indent((SystemVerilogCodeGen *)param_str.field_2._8_8_);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)puVar1,sVar11._M_str,sVar11._M_len);
        if (value_str._M_dataplus._M_p == (pointer)0x0) {
          c.super_Var.super_IRNode.fn_name_ln.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(p_Var9 + 1);
          c.super_Var.super_IRNode.fn_name_ln.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var9[1]._M_parent;
          auStack_378 = (undefined1  [8])value_str.field_2._8_8_;
          c.super_Var.super_IRNode._vptr_IRNode = (_func_int **)param_str._M_dataplus._M_p;
          format_str_01.size_ = 0xdd;
          format_str_01.data_ = (char *)0x7;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)auStack_378;
          fmt::v7::detail::vformat_abi_cxx11_(&local_b8,(detail *)"{0} {1}",format_str_01,args_01);
        }
        else {
          c.super_Var.super_IRNode.fn_name_ln.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(p_Var9 + 1);
          c.super_Var.super_IRNode.fn_name_ln.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var9[1]._M_parent;
          auStack_378 = (undefined1  [8])value_str.field_2._8_8_;
          c.super_Var.super_IRNode._vptr_IRNode = (_func_int **)param_str._M_dataplus._M_p;
          c.super_Var.super_IRNode.fn_name_ln.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)type_str.field_2._8_8_;
          c.super_Var.super_IRNode._32_8_ = value_str._M_dataplus._M_p;
          format_str_00.size_ = 0xddd;
          format_str_00.data_ = (char *)0xd;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)auStack_378;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_b8,(detail *)"{0} {1} = {2}",format_str_00,args_00);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,local_b8._M_dataplus._M_p,local_b8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (uVar10 < (generator->params_)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,",",1);
        }
        *(long *)(param_str.field_2._8_8_ + 0x178) = *(long *)(param_str.field_2._8_8_ + 0x178) + 1;
        auStack_378[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,(char *)auStack_378,1);
        if ((size_type *)value_str.field_2._8_8_ != &param_str._M_string_length) {
          operator_delete((void *)value_str.field_2._8_8_,param_str._M_string_length + 1);
        }
        if (local_98 !=
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&type_str._M_string_length) {
          operator_delete(local_98,CONCAT71(type_str._M_string_length._1_7_,
                                            (undefined1)type_str._M_string_length) + 1);
        }
        if ((size_type *)type_str.field_2._8_8_ != &value_str._M_string_length) {
          operator_delete((void *)type_str.field_2._8_8_,
                          CONCAT71(value_str._M_string_length._1_7_,
                                   (undefined1)value_str._M_string_length) + 1);
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        uVar10 = (ulong)((int)uVar10 + 1);
      } while ((_Rb_tree_header *)p_Var9 != p_Var3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,")",1);
    uVar7 = param_str.field_2._8_8_;
    *(long *)(param_str.field_2._8_8_ + 0x178) = *(long *)(param_str.field_2._8_8_ + 0x178) + 1;
    auStack_378[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,auStack_378,1);
    *(long *)(uVar7 + 0x10) = *(long *)(uVar7 + 0x10) + -1;
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::generate_parameters(Generator* generator) {
    const auto& params = generator->get_params();
    if (!params.empty()) {
        stream_ << "#(" << stream_.endl();
        indent_++;
        uint32_t count = 0;
        for (auto const& [name, param] : params) {
            std::string value_str, type_str;
            if (param->get_initial_value()) {
                auto value = *param->get_initial_value();
                auto c = Const(value, param->width(), param->is_signed());
                value_str = c.to_string();
            } else if (param->param_type() == ParamType::RawType) {
                type_str = "type";
                // determine the initial values
                if (param->get_raw_str_value()) {
                    value_str = *param->get_raw_str_value();
                }
                if (param->get_raw_str_initial_value()) {
                    // use the initial lvalue instead since it's user's intention
                    value_str = *param->get_raw_str_initial_value();
                }
            } else if (param->param_type() == ParamType::Enum) {
                type_str = param->enum_def()->name;
            } else if (param->param_type() != ParamType::Parameter) {
                if (param->has_value()) value_str = param->value_str();
            }
            std::string param_str =
                type_str.empty() ? "parameter" : ::format("parameter {0}", type_str);
            stream_ << indent()
                    << (value_str.empty() ? ::format("{0} {1}", param_str, name)
                                          : ::format("{0} {1} = {2}", param_str, name, value_str));
            if (++count < params.size()) {
                stream_ << ",";
            }
            stream_ << stream_.endl();
        }
        stream_ << ")" << stream_.endl();
        indent_--;
    }
}